

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O2

bool __thiscall
libwebm::PesOptionalHeader::Write(PesOptionalHeader *this,bool write_pts,PacketDataBuffer *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t uVar9;
  bool bVar10;
  ushort *puVar11;
  char *__ptr;
  long lVar12;
  int iVar13;
  size_t sStack_50;
  byte local_39;
  byte local_38;
  undefined1 local_37;
  undefined4 local_36;
  ushort local_32;
  
  if (buffer == (PacketDataBuffer *)0x0) {
    __ptr = "Webm2Pes: nullptr in opt header writer.\n";
    sStack_50 = 0x28;
  }
  else {
    local_32 = 0;
    local_36 = 0;
    if ((((((((this->marker).num_bits - 1U < 0x40) && (uVar1 = (this->marker).shift, uVar1 < 0x40))
           && ((this->scrambling).num_bits - 1U < 0x40)) &&
          ((uVar2 = (this->scrambling).shift, uVar2 < 0x40 &&
           ((this->priority).num_bits - 1U < 0x40)))) &&
         (((uVar3 = (this->priority).shift, uVar3 < 0x40 &&
           (((this->data_alignment).num_bits - 1U < 0x40 &&
            (uVar4 = (this->data_alignment).shift, uVar4 < 0x40)))) &&
          ((this->copyright).num_bits - 1U < 0x40)))) &&
        ((((uVar5 = (this->copyright).shift, uVar5 < 0x40 && ((this->original).num_bits - 1U < 0x40)
           ) && (uVar6 = (this->original).shift, uVar6 < 0x40)) &&
         ((((this->has_pts).num_bits - 1U < 0x40 && (uVar7 = (this->has_pts).shift, uVar7 < 0x40))
          && (((this->has_dts).num_bits - 1U < 0x40 &&
              ((uVar8 = (this->has_dts).shift, uVar8 < 0x40 &&
               (iVar13 = (this->pts).num_bits, iVar13 - 1U < 0x40)))))))))) &&
       (((uint)(this->pts).shift < 0x40 &&
        (((this->stuffing_byte).num_bits - 1U < 0x40 && ((uint)(this->stuffing_byte).shift < 0x40)))
        ))) {
      local_39 = (byte)((this->original).bits << ((byte)uVar6 & 0x3f)) |
                 (byte)((this->copyright).bits << ((byte)uVar5 & 0x3f)) |
                 (byte)((this->data_alignment).bits << ((byte)uVar4 & 0x3f)) |
                 (byte)((this->priority).bits << ((byte)uVar3 & 0x3f)) |
                 (byte)((this->scrambling).bits << ((byte)uVar2 & 0x3f)) |
                 (byte)((this->marker).bits << ((byte)uVar1 & 0x3f));
      local_38 = 0;
      if (write_pts) {
        local_38 = (byte)((this->has_pts).bits << ((byte)uVar7 & 0x3f));
      }
      local_38 = (byte)((this->has_dts).bits << ((byte)uVar8 & 0x3f)) | local_38;
      local_37 = (undefined1)(this->remaining_size).bits;
      if (write_pts) {
        uVar9 = (this->pts).bits;
        puVar11 = &local_32;
        local_36 = (undefined4)uVar9;
        local_32 = (ushort)(byte)(uVar9 >> 0x20);
        iVar13 = 1;
      }
      else {
        iVar13 = (iVar13 + 7U >> 3) + 1;
        puVar11 = (ushort *)&local_37;
      }
      uVar9 = (this->stuffing_byte).bits;
      for (lVar12 = 0; iVar13 != (int)lVar12; lVar12 = lVar12 + 1) {
        *(char *)((long)puVar11 + lVar12 + 1) = (char)uVar9;
      }
      bVar10 = CopyAndEscapeStartCodes(&local_39,9,buffer);
      return bVar10;
    }
    __ptr = "Webm2Pes: Invalid PES Optional Header field.\n";
    sStack_50 = 0x2d;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  return false;
}

Assistant:

bool PesOptionalHeader::Write(bool write_pts, PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr in opt header writer.\n");
    return false;
  }

  const int kHeaderSize = 9;
  std::uint8_t header[kHeaderSize] = {0};
  std::uint8_t* byte = header;

  if (marker.Check() != true || scrambling.Check() != true ||
      priority.Check() != true || data_alignment.Check() != true ||
      copyright.Check() != true || original.Check() != true ||
      has_pts.Check() != true || has_dts.Check() != true ||
      pts.Check() != true || stuffing_byte.Check() != true) {
    std::fprintf(stderr, "Webm2Pes: Invalid PES Optional Header field.\n");
    return false;
  }

  // TODO(tomfinegan): As noted in above, the PesHeaderFields should be an
  // array (or some data structure) that can be iterated over.

  // First byte of header, fields: marker, scrambling, priority, alignment,
  // copyright, original.
  *byte = 0;
  *byte |= marker.bits << marker.shift;
  *byte |= scrambling.bits << scrambling.shift;
  *byte |= priority.bits << priority.shift;
  *byte |= data_alignment.bits << data_alignment.shift;
  *byte |= copyright.bits << copyright.shift;
  *byte |= original.bits << original.shift;

  // Second byte of header, fields: has_pts, has_dts, unused fields.
  *++byte = 0;
  if (write_pts == true)
    *byte |= has_pts.bits << has_pts.shift;

  *byte |= has_dts.bits << has_dts.shift;

  // Third byte of header, fields: remaining size of header.
  *++byte = remaining_size.bits & 0xff;  // Field is 8 bits wide.

  int num_stuffing_bytes =
      (pts.num_bits + 7) / 8 + 1 /* always 1 stuffing byte */;
  if (write_pts == true) {
    // Write the PTS value as big endian and adjust stuffing byte count
    // accordingly.
    *++byte = pts.bits & 0xff;
    *++byte = (pts.bits >> 8) & 0xff;
    *++byte = (pts.bits >> 16) & 0xff;
    *++byte = (pts.bits >> 24) & 0xff;
    *++byte = (pts.bits >> 32) & 0xff;
    num_stuffing_bytes = 1;
  }

  // Add the stuffing byte(s).
  for (int i = 0; i < num_stuffing_bytes; ++i)
    *++byte = stuffing_byte.bits & 0xff;

  return CopyAndEscapeStartCodes(&header[0], kHeaderSize, buffer);
}